

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mioUtils.c
# Opt level: O1

void Mio_LibraryReadProfile(FILE *pFile,Mio_Library_t *pLib)

{
  int Prof;
  char *pcVar1;
  Mio_Gate_t *pGate;
  char *pcVar2;
  char pBuffer [1000];
  char acStack_418 [1000];
  
  pcVar1 = fgets(acStack_418,1000,(FILE *)pFile);
  while (pcVar1 != (char *)0x0) {
    pcVar1 = strtok(acStack_418," \t\n");
    if ((pcVar1 != (char *)0x0) && (*pcVar1 != '#')) {
      pGate = Mio_LibraryReadGateByName(pLib,pcVar1,(char *)0x0);
      if (pGate == (Mio_Gate_t *)0x0) {
        pcVar2 = Mio_LibraryReadName(pLib);
        printf("Cannot find gate \"%s\" in library \"%s\".\n",pcVar1,pcVar2);
      }
      else {
        pcVar1 = strtok((char *)0x0," \t\n");
        Prof = atoi(pcVar1);
        Mio_GateSetProfile(pGate,Prof);
      }
    }
    pcVar1 = fgets(acStack_418,1000,(FILE *)pFile);
  }
  return;
}

Assistant:

void Mio_LibraryReadProfile( FILE * pFile, Mio_Library_t * pLib )
{
    Mio_Gate_t * pGate;    
    char pBuffer[1000];
    while ( fgets( pBuffer, 1000, pFile ) != NULL )
    {
        char * pToken = strtok( pBuffer, " \t\n" );
        if ( pToken == NULL )
            continue;
        if ( pToken[0] == '#' )
            continue;
        // read gate
        pGate = Mio_LibraryReadGateByName( pLib, pToken, NULL );
        if ( pGate == NULL )
        {
            printf( "Cannot find gate \"%s\" in library \"%s\".\n", pToken, Mio_LibraryReadName(pLib) );
            continue;
        }
        // read profile
        pToken = strtok( NULL, " \t\n" );
        Mio_GateSetProfile( pGate, atoi(pToken) );
    }
}